

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,void *dict,size_t dictSize)

{
  FSE_repeat FVar1;
  uint maxSymbolValue_00;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  void *pvVar7;
  U32 *pUVar8;
  ulong uVar9;
  uint litlengthMaxValue;
  uint litlengthLog;
  uint offcodeMaxValue;
  void *local_f0;
  uint maxSymbolValue;
  short offcodeNCount [32];
  
  offcodeMaxValue = 0x1f;
  offcodeNCount[0] = 1;
  offcodeNCount[1] = 0;
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  maxSymbolValue = 0xff;
  sVar2 = HUF_readCTable((HUF_CElt *)bs,&maxSymbolValue,(void *)((long)dict + 8),dictSize - 8,
                         (uint *)offcodeNCount);
  if (offcodeNCount._0_4_ == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  sVar3 = 0;
  if (0xfe < maxSymbolValue && sVar2 < 0xffffffffffffff89) {
    sVar3 = sVar2;
  }
  sVar6 = 0xffffffffffffffe2;
  if (0xfe < maxSymbolValue && sVar2 < 0xffffffffffffff89) {
    uVar9 = dictSize + (long)dict;
    pvVar7 = (void *)((long)dict + 8 + sVar3);
    local_f0 = workspace;
    sVar2 = FSE_readNCount(offcodeNCount,&offcodeMaxValue,&maxSymbolValue,pvVar7,
                           uVar9 - (long)pvVar7);
    if (((sVar2 < 0xffffffffffffff89) && (maxSymbolValue < 9)) &&
       (sVar3 = FSE_buildCTable_wksp
                          ((bs->entropy).fse.offcodeCTable,offcodeNCount,0x1f,maxSymbolValue,
                           local_f0,0x2200), sVar3 < 0xffffffffffffff89)) {
      pvVar7 = (void *)((long)pvVar7 + sVar2);
      litlengthMaxValue = 0x34;
      sVar2 = FSE_readNCount((short *)&maxSymbolValue,&litlengthMaxValue,&litlengthLog,pvVar7,
                             uVar9 - (long)pvVar7);
      if (((sVar2 < 0xffffffffffffff89) && (litlengthLog < 10)) &&
         (sVar3 = FSE_buildCTable_wksp
                            ((bs->entropy).fse.matchlengthCTable,(short *)&maxSymbolValue,
                             litlengthMaxValue,litlengthLog,local_f0,0x2200),
         sVar3 < 0xffffffffffffff89)) {
        FVar1 = ZSTD_dictNCountRepeat((short *)&maxSymbolValue,litlengthMaxValue,0x34);
        (bs->entropy).fse.matchlength_repeatMode = FVar1;
        pvVar7 = (void *)((long)pvVar7 + sVar2);
        litlengthMaxValue = 0x23;
        sVar2 = FSE_readNCount((short *)&maxSymbolValue,&litlengthMaxValue,&litlengthLog,pvVar7,
                               uVar9 - (long)pvVar7);
        if (((sVar2 < 0xffffffffffffff89) && (litlengthLog < 10)) &&
           (sVar3 = FSE_buildCTable_wksp
                              ((bs->entropy).fse.litlengthCTable,(short *)&maxSymbolValue,
                               litlengthMaxValue,litlengthLog,local_f0,0x2200),
           sVar3 < 0xffffffffffffff89)) {
          FVar1 = ZSTD_dictNCountRepeat((short *)&maxSymbolValue,litlengthMaxValue,0x23);
          (bs->entropy).fse.litlength_repeatMode = FVar1;
          uVar5 = (long)pvVar7 + sVar2 + 0xc;
          if (uVar5 <= uVar9) {
            pUVar8 = (U32 *)((long)pvVar7 + sVar2);
            bs->rep[0] = *pUVar8;
            bs->rep[1] = pUVar8[1];
            bs->rep[2] = pUVar8[2];
            uVar9 = uVar9 - uVar5;
            maxSymbolValue_00 = 0x1f;
            if (uVar9 >> 0x11 < 0x7fff) {
              maxSymbolValue_00 = ZSTD_highbit32((int)uVar9 + 0x20000);
            }
            FVar1 = ZSTD_dictNCountRepeat(offcodeNCount,offcodeMaxValue,maxSymbolValue_00);
            (bs->entropy).fse.offcode_repeatMode = FVar1;
            lVar4 = 0;
            while (lVar4 != 3) {
              pUVar8 = bs->rep + lVar4;
              if ((ulong)*pUVar8 == 0) {
                return 0xffffffffffffffe2;
              }
              lVar4 = lVar4 + 1;
              if (uVar9 < *pUVar8) {
                return 0xffffffffffffffe2;
              }
            }
            sVar6 = uVar5 - (long)dict;
          }
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         const void* const dict, size_t dictSize)
{
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted, "");
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.matchlength_repeatMode = ZSTD_dictNCountRepeat(matchlengthNCount, matchlengthMaxValue, MaxML);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.litlength_repeatMode = ZSTD_dictNCountRepeat(litlengthNCount, litlengthMaxValue, MaxLL);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable for a valid table */
        bs->entropy.fse.offcode_repeatMode = ZSTD_dictNCountRepeat(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff));

        /* All repCodes must be <= dictContentSize and != 0 */
        {   U32 u;
            for (u=0; u<3; u++) {
                RETURN_ERROR_IF(bs->rep[u] == 0, dictionary_corrupted, "");
                RETURN_ERROR_IF(bs->rep[u] > dictContentSize, dictionary_corrupted, "");
    }   }   }

    return dictPtr - (const BYTE*)dict;
}